

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O1

Uint64 __thiscall Diligent::FenceVkImpl::GetCompletedValue(FenceVkImpl *this)

{
  VkResult VVar1;
  int iVar2;
  Uint64 UVar3;
  Uint64 SemaphoreCounter;
  string msg;
  uint64_t local_38;
  string local_30;
  
  if ((this->m_TimelineSemaphore).m_VkObject == (VkSemaphore_T *)0x0) {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_SyncPointsGuard);
    if (iVar2 != 0) {
      std::__throw_system_error(iVar2);
    }
    UVar3 = InternalGetCompletedValue(this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_SyncPointsGuard);
    local_38 = UVar3;
  }
  else {
    local_38 = 0xffffffffffffffff;
    VVar1 = VulkanUtilities::VulkanLogicalDevice::GetSemaphoreCounter
                      ((((this->super_FenceBase<Diligent::EngineVkImplTraits>).
                         super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                        .m_pDevice)->m_LogicalVkDevice).
                       super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(this->m_TimelineSemaphore).m_VkObject,&local_38);
    if (VVar1 != VK_SUCCESS) {
      FormatString<char[41]>(&local_30,(char (*) [41])"Failed to get timeline semaphore counter");
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"GetCompletedValue",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/FenceVkImpl.cpp"
                 ,0x75);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return local_38;
}

Assistant:

Uint64 FenceVkImpl::GetCompletedValue()
{
    if (IsTimelineSemaphore())
    {
        // GetSemaphoreCounter() is thread safe

        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

        Uint64   SemaphoreCounter = ~Uint64{0};
        VkResult err              = LogicalDevice.GetSemaphoreCounter(m_TimelineSemaphore, &SemaphoreCounter);
        DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to get timeline semaphore counter");
        return SemaphoreCounter;
    }
    else
    {
        std::lock_guard<std::mutex> Lock{m_SyncPointsGuard};
        return InternalGetCompletedValue();
    }
}